

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_timer.cpp
# Opt level: O0

timer_ticks __thiscall crnlib::timer::get_elapsed_us(timer *this)

{
  timer_ticks delta;
  timer_ticks stop_time;
  timer *this_local;
  
  if ((this->field_0x10 & 1) == 0) {
    this_local = (timer *)0x0;
  }
  else {
    delta = this->m_stop_time;
    if (((byte)this->field_0x10 >> 1 & 1) == 0) {
      stop_time = (timer_ticks)this;
      query_counter(&delta);
    }
    this_local = (timer *)(((delta - this->m_start_time) * 1000000 + (g_freq >> 1)) / g_freq);
  }
  return (timer_ticks)this_local;
}

Assistant:

timer_ticks timer::get_elapsed_us() const
    {
        CRNLIB_ASSERT(m_started);
        if (!m_started)
        {
            return 0;
        }

        timer_ticks stop_time = m_stop_time;
        if (!m_stopped)
        {
            query_counter(&stop_time);
        }

        timer_ticks delta = stop_time - m_start_time;
        return (delta * 1000000ULL + (g_freq >> 1U)) / g_freq;
    }